

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O3

bool __thiscall
tlx::CmdlineParser::ArgumentSizeT::process(ArgumentSizeT *this,int *argc,char ***argv)

{
  bool bVar1;
  char *in_RAX;
  ulonglong uVar2;
  char *endptr;
  char *local_28;
  
  if (*argc != 0) {
    local_28 = in_RAX;
    uVar2 = strtoull(**argv,&local_28,10);
    if ((local_28 == (char *)0x0) || (*local_28 != '\0')) {
      bVar1 = false;
    }
    else {
      *argc = *argc + -1;
      *argv = *argv + 1;
      *this->dest_ = uVar2;
      bVar1 = true;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        char* endptr;
        unsigned long long x = strtoull(argv[0], &endptr, 10);
        if (endptr != nullptr && *endptr == 0 &&
            x <= std::numeric_limits<size_t>::max()) {
            --argc, ++argv;
            dest_ = x;
            return true;
        }
        else {
            return false;
        }
    }